

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::RegisterConstant
          (ConstantManager *this,
          unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
          *cst)

{
  reference ppCVar1;
  pair<std::__detail::_Node_iterator<const_spvtools::opt::analysis::Constant_*,_true,_true>,_bool>
  pVar2;
  pointer local_30;
  _Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true> local_28;
  pair<std::__detail::_Node_iterator<const_spvtools::opt::analysis::Constant_*,_true,_true>,_bool>
  ret;
  unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
  *cst_local;
  ConstantManager *this_local;
  
  ret._8_8_ = cst;
  local_30 = std::
             unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
             ::get(cst);
  pVar2 = std::
          unordered_set<const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantHash,_spvtools::opt::analysis::ConstantEqual,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::insert(&this->const_pool_,&local_30);
  local_28._M_cur =
       (__node_type *)
       pVar2.first.super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>._M_cur
  ;
  ret.first.super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>._M_cur._0_1_
       = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::
    vector<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>
              ((vector<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>>
                *)&this->owned_constants_,cst);
  }
  ppCVar1 = std::__detail::_Node_iterator<const_spvtools::opt::analysis::Constant_*,_true,_true>::
            operator*((_Node_iterator<const_spvtools::opt::analysis::Constant_*,_true,_true> *)
                      &local_28);
  return *ppCVar1;
}

Assistant:

const Constant* RegisterConstant(std::unique_ptr<Constant> cst) {
    auto ret = const_pool_.insert(cst.get());
    if (ret.second) {
      owned_constants_.emplace_back(std::move(cst));
    }
    return *ret.first;
  }